

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curi.c
# Opt level: O2

curi_status parse_h16(char *uri,size_t len,size_t *offset,curi_settings *settings,void *userData)

{
  size_t sVar1;
  curi_status cVar2;
  curi_status cVar3;
  char *pcVar4;
  ulong uVar5;
  long lVar6;
  bool bVar7;
  
  uVar5 = *offset;
  pcVar4 = uri + uVar5;
  if (len <= uVar5) {
    pcVar4 = "";
  }
  *offset = uVar5 + 1;
  if ((byte)(*pcVar4 - 0x30U) < 0x37) {
    cVar2 = *(curi_status *)(&DAT_0019261c + (ulong)(byte)(*pcVar4 - 0x30U) * 4);
  }
  else {
    cVar2 = curi_status_error;
  }
  lVar6 = 3;
  sVar1 = uVar5 + 1;
  while (cVar3 = cVar2, uVar5 = sVar1, bVar7 = lVar6 != 0, lVar6 = lVar6 + -1, bVar7) {
    pcVar4 = uri + uVar5;
    if (len <= uVar5) {
      pcVar4 = "";
    }
    *offset = uVar5 + 1;
    if ((0x36 < (byte)*pcVar4 - 0x30) ||
       (sVar1 = uVar5 + 1, cVar2 = curi_status_success,
       (0x7e0000007e03ffU >> ((ulong)((byte)*pcVar4 - 0x30) & 0x3f) & 1) == 0)) {
      *offset = uVar5;
      sVar1 = uVar5;
      cVar2 = cVar3;
    }
  }
  return cVar3;
}

Assistant:

static curi_status parse_h16(const char* uri, size_t len, size_t* offset, const curi_settings* settings, void* userData)
{
    // h16 = 1*4HEXDIG
    curi_status status = curi_status_success;
    size_t i;

    if (status == curi_status_success)
        status = parse_hexdigit(uri, len, offset, settings, userData);

    for (i = 0 ; i < 3 ; ++i)
        TRY(status,offset,parse_hexdigit(uri, len, offset, settings, userData));

    return status;
}